

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_aa32_frob64(DisasContext_conflict1 *s,TCGv_i64 val)

{
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i64 val_local;
  DisasContext_conflict1 *s_local;
  
  if (((s->uc->mode & UC_MODE_ARMBE8) != UC_MODE_ARM) && (s->sctlr_b != 0)) {
    tcg_gen_rotri_i64_aarch64(s->uc->tcg_ctx,val,val,0x20);
  }
  return;
}

Assistant:

static inline void gen_aa32_frob64(DisasContext *s, TCGv_i64 val)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    /* Not needed for user-mode BE32, where we use MO_BE instead.  */
    // Unicorn: By default UC_MODE_BIG_MODE is BE32 mode, which in fact qemu-usermode.
    //          Thus, we only do this in BE8 (qemu system) mode.
    if ( (s->uc->mode & UC_MODE_ARMBE8) && s->sctlr_b) {
        tcg_gen_rotri_i64(tcg_ctx, val, val, 32);
    }
}